

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_append_entries.cxx
# Opt level: O0

bool __thiscall nuraft::raft_server::request_append_entries(raft_server *this,ptr<peer> *p)

{
  int32_t iVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  bool bVar4;
  int iVar5;
  srv_role sVar6;
  __int_type_conflict _Var7;
  int32 iVar8;
  int iVar9;
  uint uVar10;
  msg_type mVar11;
  int32 iVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  element_type *peVar17;
  element_type *peVar18;
  size_t sVar19;
  size_t sVar20;
  uint64_t uVar21;
  element_type *peVar22;
  element_type *_ctx;
  element_type *peVar23;
  ulong uVar24;
  ulong uVar25;
  long in_RDI;
  int32 last_ts_ms;
  Param param;
  int32 last_ts_ms_1;
  rpc_handler m_handler;
  ptr<req_msg> msg;
  uint64_t p_next_log_idx;
  bool reconnected;
  int32 last_active_time_ms;
  bool need_to_reconnect;
  ptr<raft_params> clone_1;
  ptr<raft_params> clone;
  bool do_adjustment;
  size_t num_stale_peers;
  size_t cur_quorum_size;
  size_t num_not_responding_peers;
  ptr<raft_params> params;
  CbReturnCode rc;
  Param cb_param;
  peer *in_stack_fffffffffffffa18;
  undefined4 in_stack_fffffffffffffa20;
  Type in_stack_fffffffffffffa24;
  undefined4 in_stack_fffffffffffffa28;
  undefined4 in_stack_fffffffffffffa2c;
  peer *in_stack_fffffffffffffa30;
  undefined4 in_stack_fffffffffffffa38;
  undefined4 in_stack_fffffffffffffa3c;
  undefined4 in_stack_fffffffffffffa40;
  undefined4 in_stack_fffffffffffffa44;
  undefined8 in_stack_fffffffffffffa58;
  undefined4 in_stack_fffffffffffffa60;
  undefined4 in_stack_fffffffffffffa64;
  snapshot_io_mgr *in_stack_fffffffffffffa68;
  undefined4 in_stack_fffffffffffffa70;
  undefined4 in_stack_fffffffffffffa74;
  raft_server *in_stack_fffffffffffffa78;
  undefined4 in_stack_fffffffffffffa98;
  undefined4 in_stack_fffffffffffffa9c;
  raft_server *in_stack_fffffffffffffaa0;
  undefined4 in_stack_fffffffffffffaa8;
  undefined4 in_stack_fffffffffffffaac;
  peer *in_stack_fffffffffffffae0;
  undefined4 in_stack_fffffffffffffae8;
  undefined4 in_stack_fffffffffffffaec;
  bool local_4f1;
  rpc_handler *in_stack_fffffffffffffbc8;
  uint in_stack_fffffffffffffbd0;
  int in_stack_fffffffffffffbd4;
  int32 in_stack_fffffffffffffbd8;
  int32 in_stack_fffffffffffffbdc;
  string local_380 [32];
  string local_360 [36];
  uint local_33c;
  string local_328 [32];
  string local_308 [32];
  string local_2e8 [32];
  Param local_2c8;
  string local_2a0 [32];
  uint local_280;
  byte local_279;
  __shared_ptr local_278 [32];
  string local_258 [112];
  __shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2> local_1e8;
  string local_1d8 [36];
  undefined4 local_1b4;
  string local_1b0 [32];
  string local_190 [32];
  ulong local_170;
  byte local_161;
  string local_160 [32];
  string local_140 [32];
  uint local_120;
  byte local_119;
  string local_108 [48];
  string local_d8 [32];
  string local_b8 [24];
  ptr<peer> *in_stack_ffffffffffffff60;
  undefined7 in_stack_ffffffffffffff68;
  char in_stack_ffffffffffffff6f;
  string local_68 [36];
  ReturnCode local_44;
  Param local_40 [2];
  byte local_1;
  
  iVar9 = (int)((ulong)in_stack_fffffffffffffa58 >> 0x20);
  if ((request_append_entries(std::shared_ptr<nuraft::peer>)::chk_timer == '\0') &&
     (iVar5 = __cxa_guard_acquire(&request_append_entries(std::shared_ptr<nuraft::peer>)::chk_timer)
     , iVar5 != 0)) {
    timer_helper::timer_helper
              ((timer_helper *)in_stack_fffffffffffffa30,
               CONCAT44(in_stack_fffffffffffffa2c,in_stack_fffffffffffffa28),
               SUB41(in_stack_fffffffffffffa24 >> 0x18,0));
    __cxa_guard_release(&request_append_entries(std::shared_ptr<nuraft::peer>)::chk_timer);
  }
  sVar6 = std::atomic::operator_cast_to_srv_role((atomic<nuraft::srv_role> *)0x1a7dfe);
  if (sVar6 != leader) {
    local_1 = 0;
    goto LAB_001a9e66;
  }
  iVar1 = *(int32_t *)(in_RDI + 0x38);
  _Var7 = std::__atomic_base::operator_cast_to_int
                    ((__atomic_base<int> *)
                     CONCAT44(in_stack_fffffffffffffa2c,in_stack_fffffffffffffa28));
  std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x1a7e64
            );
  iVar8 = peer::get_id((peer *)0x1a7e6c);
  cb_func::Param::Param(local_40,iVar1,_Var7,iVar8,(void *)0x0);
  std::unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_>::operator->
            ((unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_> *)0x1a7ea2);
  local_44 = cb_func::call((cb_func *)CONCAT44(in_stack_fffffffffffffa2c,in_stack_fffffffffffffa28),
                           in_stack_fffffffffffffa24,(Param *)in_stack_fffffffffffffa18);
  if (local_44 == ReturnNull) {
    bVar4 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
    if (bVar4) {
      peVar17 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x1a7f01);
      iVar9 = (**(code **)(*(long *)peVar17 + 0x38))();
      if (2 < iVar9) {
        peVar17 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x1a7f27);
        msg_if_given_abi_cxx11_((char *)local_68,"by callback, abort request_append_entries");
        (**(code **)(*(long *)peVar17 + 0x40))
                  (peVar17,3,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_append_entries.cxx"
                   ,"request_append_entries",0x9a,local_68);
        std::__cxx11::string::~string(local_68);
      }
    }
    local_1 = 1;
    goto LAB_001a9e66;
  }
  std::unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_>::operator->
            ((unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_> *)0x1a7fd7);
  nuraft::context::get_params
            ((context *)CONCAT44(in_stack_fffffffffffffa3c,in_stack_fffffffffffffa38));
  peVar18 = std::__shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x1a7ff4);
  if ((((peVar18->auto_adjust_quorum_for_small_cluster_ & 1U) != 0) &&
      (iVar8 = get_num_voting_members
                         ((raft_server *)
                          CONCAT44(in_stack_fffffffffffffa74,in_stack_fffffffffffffa70)), iVar8 == 2
      )) && (bVar4 = timer_helper::timeout_and_reset((timer_helper *)in_stack_fffffffffffffa68),
            bVar4)) {
    sVar19 = get_not_responding_peers(in_stack_fffffffffffffaa0);
    iVar8 = get_quorum_for_commit
                      ((raft_server *)CONCAT44(in_stack_fffffffffffffa9c,in_stack_fffffffffffffa98))
    ;
    sVar20 = get_num_stale_peers(in_stack_fffffffffffffa78);
    if (iVar8 == 0) {
      if (((sVar19 == 0) && (sVar20 == 0)) &&
         (peVar18 = std::
                    __shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)0x1a83f1), peVar18->custom_commit_quorum_size_ == 1)) {
        bVar4 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
        if (bVar4) {
          peVar17 = std::
                    __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                    operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x1a842c);
          iVar5 = (**(code **)(*(long *)peVar17 + 0x38))();
          if (2 < iVar5) {
            peVar17 = std::
                      __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)0x1a8465);
            msg_if_given_abi_cxx11_
                      ((char *)local_108,
                       "2-node cluster\'s follower is responding now, restore quorum with default value"
                      );
            (**(code **)(*(long *)peVar17 + 0x40))
                      (peVar17,3,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_append_entries.cxx"
                       ,"request_append_entries",0xbf,local_108);
            std::__cxx11::string::~string(local_108);
          }
        }
        std::__shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator*((__shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   *)CONCAT44(in_stack_fffffffffffffa24,in_stack_fffffffffffffa20));
        cs_new<nuraft::raft_params,nuraft::raft_params&>((raft_params *)in_stack_fffffffffffffa18);
        peVar18 = std::
                  __shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x1a8522);
        peVar18->custom_commit_quorum_size_ = 0;
        peVar18 = std::
                  __shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x1a8536);
        peVar18->custom_election_quorum_size_ = 0;
        std::unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_>::operator->
                  ((unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_> *)0x1a8551);
        nuraft::context::set_params
                  ((context *)in_stack_fffffffffffffa30,
                   (ptr<raft_params> *)CONCAT44(in_stack_fffffffffffffa2c,in_stack_fffffffffffffa28)
                  );
        std::shared_ptr<nuraft::raft_params>::~shared_ptr
                  ((shared_ptr<nuraft::raft_params> *)0x1a8570);
      }
    }
    else {
      in_stack_ffffffffffffff6f = '\0';
      if (sVar19 == 0) {
        if (sVar20 != 0) {
          bVar4 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
          if (bVar4) {
            peVar17 = std::
                      __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)0x1a823d);
            iVar5 = (**(code **)(*(long *)peVar17 + 0x38))();
            if (2 < iVar5) {
              peVar17 = std::
                        __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                      *)0x1a8276);
              msg_if_given_abi_cxx11_
                        ((char *)local_d8,
                         "2-node cluster\'s follower is lagging behind, adjust quorum to 1");
              (**(code **)(*(long *)peVar17 + 0x40))
                        (peVar17,3,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_append_entries.cxx"
                         ,"request_append_entries",0xb0,local_d8);
              std::__cxx11::string::~string(local_d8);
            }
          }
          in_stack_ffffffffffffff6f = '\x01';
        }
      }
      else {
        bVar4 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
        if (bVar4) {
          peVar17 = std::
                    __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                    operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x1a8115);
          iVar5 = (**(code **)(*(long *)peVar17 + 0x38))();
          if (2 < iVar5) {
            peVar17 = std::
                      __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)0x1a814e);
            msg_if_given_abi_cxx11_
                      ((char *)local_b8,
                       "2-node cluster\'s follower is not responding long time, adjust quorum to 1")
            ;
            (**(code **)(*(long *)peVar17 + 0x40))
                      (peVar17,3,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_append_entries.cxx"
                       ,"request_append_entries",0xac,local_b8);
            std::__cxx11::string::~string(local_b8);
          }
        }
        in_stack_ffffffffffffff6f = '\x01';
      }
      if (in_stack_ffffffffffffff6f != '\0') {
        std::__shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator*((__shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   *)CONCAT44(in_stack_fffffffffffffa24,in_stack_fffffffffffffa20));
        cs_new<nuraft::raft_params,nuraft::raft_params&>((raft_params *)in_stack_fffffffffffffa18);
        peVar18 = std::
                  __shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x1a834b);
        peVar18->custom_commit_quorum_size_ = 1;
        peVar18 = std::
                  __shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x1a835f);
        peVar18->custom_election_quorum_size_ = 1;
        std::unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_>::operator->
                  ((unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_> *)0x1a837a);
        nuraft::context::set_params
                  ((context *)in_stack_fffffffffffffa30,
                   (ptr<raft_params> *)CONCAT44(in_stack_fffffffffffffa2c,in_stack_fffffffffffffa28)
                  );
        std::shared_ptr<nuraft::raft_params>::~shared_ptr
                  ((shared_ptr<nuraft::raft_params> *)0x1a8399);
      }
    }
  }
  std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x1a85a9
            );
  local_119 = peer::need_to_reconnect
                        ((peer *)CONCAT44(in_stack_fffffffffffffa2c,in_stack_fffffffffffffa28));
  std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x1a85d7
            );
  uVar21 = peer::get_active_timer_us((peer *)0x1a85df);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar21;
  uVar16 = SUB164(auVar2 / ZEXT816(1000),0);
  local_120 = uVar16;
  peVar18 = std::__shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x1a861d);
  iVar8 = peVar18->heart_beat_interval_;
  _Var7 = std::__atomic_base::operator_cast_to_int
                    ((__atomic_base<int> *)
                     CONCAT44(in_stack_fffffffffffffa2c,in_stack_fffffffffffffa28));
  if (iVar8 * _Var7 < (int)uVar16) {
    bVar4 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x3b8));
    if (bVar4) {
      std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x1a8683);
      in_stack_fffffffffffffbdc = peer::get_id((peer *)0x1a868b);
      std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x1a86a1);
      in_stack_fffffffffffffbd8 = peer::get_id((peer *)0x1a86a9);
      if (in_stack_fffffffffffffbdc == in_stack_fffffffffffffbd8) {
        bVar4 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
        if (bVar4) {
          peVar17 = std::
                    __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                    operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x1a86f9);
          in_stack_fffffffffffffbd4 = (**(code **)(*(long *)peVar17 + 0x38))();
          if (2 < in_stack_fffffffffffffbd4) {
            in_stack_fffffffffffffbc8 =
                 (rpc_handler *)
                 std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x1a8732);
            std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x1a8747);
            in_stack_fffffffffffffbd0 = peer::get_id((peer *)0x1a874f);
            msg_if_given_abi_cxx11_
                      ((char *)local_140,
                       "connection to peer %d is not active long time: %d ms, but this peer should be removed. do nothing"
                       ,(ulong)in_stack_fffffffffffffbd0,(ulong)local_120);
            (**(code **)(*(long *)&(in_stack_fffffffffffffbc8->super__Function_base)._M_functor +
                        0x40))(in_stack_fffffffffffffbc8,3,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_append_entries.cxx"
                               ,"request_append_entries",0xd3,local_140);
            std::__cxx11::string::~string(local_140);
          }
        }
        goto LAB_001a892e;
      }
    }
    bVar4 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
    if (bVar4) {
      peVar17 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x1a881d);
      iVar5 = (**(code **)(*(long *)peVar17 + 0x38))();
      if (2 < iVar5) {
        peVar17 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x1a8856);
        std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                  ((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   0x1a886b);
        uVar10 = peer::get_id((peer *)0x1a8873);
        msg_if_given_abi_cxx11_
                  ((char *)local_160,
                   "connection to peer %d is not active long time: %d ms, force re-connect",
                   (ulong)uVar10,(ulong)local_120);
        (**(code **)(*(long *)peVar17 + 0x40))
                  (peVar17,3,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_append_entries.cxx"
                   ,"request_append_entries",0xd8,local_160);
        std::__cxx11::string::~string(local_160);
      }
    }
    local_119 = 1;
    std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x1a8920);
    peer::reset_active_timer((peer *)0x1a8928);
  }
LAB_001a892e:
  if ((local_119 & 1) != 0) {
    std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
              ((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               CONCAT44(in_stack_fffffffffffffa24,in_stack_fffffffffffffa20));
    local_161 = reconnect_client((raft_server *)
                                 CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8),
                                 in_stack_fffffffffffffae0);
    std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x1a897f);
    local_170 = peer::get_next_log_idx((peer *)0x1a8987);
    if (((local_161 & 1) != 0) && (local_170 != 0)) {
      bVar4 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
      if (bVar4) {
        peVar17 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x1a89ef);
        iVar5 = (**(code **)(*(long *)peVar17 + 0x38))();
        if (5 < iVar5) {
          peVar17 = std::
                    __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                    operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x1a8a28);
          std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                     0x1a8a3d);
          uVar10 = peer::get_id((peer *)0x1a8a45);
          uVar24 = local_170;
          peVar22 = std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)0x1a8a6b);
          uVar25 = peer::get_matched_idx(peVar22);
          msg_if_given_abi_cxx11_
                    ((char *)local_190,
                     "new rpc for peer %d is created, reset next log idx (%lu) and matched log idx (%lu)"
                     ,(ulong)uVar10,uVar24,uVar25);
          (**(code **)(*(long *)peVar17 + 0x40))
                    (peVar17,6,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_append_entries.cxx"
                     ,"request_append_entries",0xf6,local_190);
          std::__cxx11::string::~string(local_190);
        }
      }
      std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x1a8b22);
      peer::set_next_log_idx
                ((peer *)CONCAT44(in_stack_fffffffffffffa24,in_stack_fffffffffffffa20),
                 (ulong)in_stack_fffffffffffffa18);
      peVar22 = std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x1a8b3d);
      peer::set_matched_idx(peVar22,0);
    }
    std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x1a8b5a);
    peer::clear_reconnection((peer *)0x1a8b62);
  }
  peVar18 = std::__shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x1a8b73);
  if ((peVar18->use_bg_thread_for_snapshot_io_ & 1U) == 0) {
LAB_001a8d11:
    std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x1a8d1e);
    bVar4 = peer::make_busy((peer *)CONCAT44(in_stack_fffffffffffffa24,in_stack_fffffffffffffa20));
    if (bVar4) {
      bVar4 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
      if (bVar4) {
        peVar17 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x1a8d70);
        iVar9 = (**(code **)(*(long *)peVar17 + 0x38))();
        if (5 < iVar9) {
          peVar17 = std::
                    __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                    operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x1a8da9);
          std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                     0x1a8dbe);
          uVar10 = peer::get_id((peer *)0x1a8dc6);
          msg_if_given_abi_cxx11_((char *)local_1d8,"send request to %d\n",(ulong)uVar10);
          (**(code **)(*(long *)peVar17 + 0x40))
                    (peVar17,6,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_append_entries.cxx"
                     ,"request_append_entries",0x107,local_1d8);
          std::__cxx11::string::~string(local_1d8);
        }
      }
      std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x1a8e64);
      peer::get_rsv_msg(in_stack_fffffffffffffa18);
      std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x1a8e83);
      peer::get_rsv_msg_handler(in_stack_fffffffffffffa18);
      bVar4 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&local_1e8);
      if (bVar4) {
        std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                  ((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   0x1a8eb8);
        std::shared_ptr<nuraft::req_msg>::shared_ptr
                  ((shared_ptr<nuraft::req_msg> *)
                   CONCAT44(in_stack_fffffffffffffa24,in_stack_fffffffffffffa20),
                   in_stack_fffffffffffffa18);
        std::
        function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>
        ::function((function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>
                    *)CONCAT44(in_stack_fffffffffffffa24,in_stack_fffffffffffffa20),
                   in_stack_fffffffffffffa18);
        peer::set_rsv_msg(in_stack_fffffffffffffa30,
                          (ptr<req_msg> *)
                          CONCAT44(in_stack_fffffffffffffa2c,in_stack_fffffffffffffa28),
                          (rpc_handler *)
                          CONCAT44(in_stack_fffffffffffffa24,in_stack_fffffffffffffa20));
        std::
        function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>
        ::~function((function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>
                     *)0x1a8f2a);
        std::shared_ptr<nuraft::req_msg>::~shared_ptr((shared_ptr<nuraft::req_msg> *)0x1a8f37);
        bVar4 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
        if (bVar4) {
          peVar17 = std::
                    __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                    operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x1a8f68);
          iVar9 = (**(code **)(*(long *)peVar17 + 0x38))();
          if (3 < iVar9) {
            peVar17 = std::
                      __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)0x1a8fa1);
            std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x1a8fb6);
            uVar10 = peer::get_id((peer *)0x1a8fbe);
            peVar23 = std::
                      __shared_ptr_access<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)0x1a8fd4);
            mVar11 = msg_base::get_type(&peVar23->super_msg_base);
            msg_if_given_abi_cxx11_
                      ((char *)local_258,"found reserved message to peer %d, type %d",(ulong)uVar10,
                       (ulong)mVar11);
            (**(code **)(*(long *)peVar17 + 0x40))
                      (peVar17,4,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_append_entries.cxx"
                       ,"request_append_entries",0x110,local_258);
            std::__cxx11::string::~string(local_258);
          }
        }
      }
      else {
        create_append_entries_req
                  ((raft_server *)CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68),
                   in_stack_ffffffffffffff60);
        std::shared_ptr<nuraft::req_msg>::operator=
                  ((shared_ptr<nuraft::req_msg> *)
                   CONCAT44(in_stack_fffffffffffffa24,in_stack_fffffffffffffa20),
                   (shared_ptr<nuraft::req_msg> *)in_stack_fffffffffffffa18);
        std::shared_ptr<nuraft::req_msg>::~shared_ptr((shared_ptr<nuraft::req_msg> *)0x1a9127);
        std::
        function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>
        ::operator=((function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>
                     *)CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40),
                    (function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>
                     *)CONCAT44(in_stack_fffffffffffffa3c,in_stack_fffffffffffffa38));
      }
      bVar4 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&local_1e8);
      if (bVar4) {
        std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                  ((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   0x1a924d);
        bVar4 = peer::is_manual_free((peer *)0x1a9255);
        if (bVar4) {
          std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                     0x1a94ee);
          peer::reset_manual_free((peer *)0x1a94f6);
        }
        else {
          std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                     0x1a927c);
          iVar12 = peer::get_long_puase_warnings((peer *)0x1a9284);
          _Var7 = std::__atomic_base::operator_cast_to_int
                            ((__atomic_base<int> *)
                             CONCAT44(in_stack_fffffffffffffa2c,in_stack_fffffffffffffa28));
          if (_Var7 <= iVar12) {
            std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x1a92bb);
            uVar21 = peer::get_ls_timer_us((peer *)0x1a92c3);
            local_280 = (uint)(uVar21 / 1000);
            peVar22 = std::
                      __shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                      operator->((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)0x1a9300);
            peer::inc_recovery_cnt(peVar22);
            bVar4 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
            if (bVar4) {
              peVar17 = std::
                        __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                      *)0x1a933b);
              iVar9 = (**(code **)(*(long *)peVar17 + 0x38))();
              if (2 < iVar9) {
                peVar17 = std::
                          __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                        *)0x1a9374);
                std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x1a9389);
                uVar13 = peer::get_id((peer *)0x1a9391);
                std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x1a93a7);
                uVar14 = peer::get_long_puase_warnings((peer *)0x1a93af);
                uVar10 = local_280;
                std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x1a93d3);
                uVar15 = peer::get_recovery_cnt((peer *)0x1a93db);
                msg_if_given_abi_cxx11_
                          ((char *)local_2a0,
                           "recovered from long pause to peer %d, %d warnings, %d ms, %d times",
                           (ulong)uVar13,(ulong)uVar14,(ulong)uVar10,(ulong)uVar15);
                (**(code **)(*(long *)peVar17 + 0x40))
                          (peVar17,3,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_append_entries.cxx"
                           ,"request_append_entries",0x12e,local_2a0);
                std::__cxx11::string::~string(local_2a0);
              }
            }
            std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x1a9490);
            iVar12 = peer::get_recovery_cnt((peer *)0x1a9498);
            if (9 < iVar12) {
              std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x1a94ba);
              peer::reset_recovery_cnt((peer *)0x1a94c2);
            }
          }
          std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                     0x1a94d5);
          peer::reset_long_pause_warnings((peer *)0x1a94dd);
        }
        std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                  ((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   0x1a9507);
        std::shared_ptr<nuraft::peer>::shared_ptr
                  ((shared_ptr<nuraft::peer> *)
                   CONCAT44(in_stack_fffffffffffffa24,in_stack_fffffffffffffa20),
                   (shared_ptr<nuraft::peer> *)in_stack_fffffffffffffa18);
        peer::send_req((peer *)CONCAT44(uVar16,iVar8),
                       (ptr<peer> *)CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8),
                       (ptr<req_msg> *)CONCAT44(in_stack_fffffffffffffbd4,in_stack_fffffffffffffbd0)
                       ,in_stack_fffffffffffffbc8);
        std::shared_ptr<nuraft::peer>::~shared_ptr((shared_ptr<nuraft::peer> *)0x1a9560);
        std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                  ((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   0x1a956d);
        peer::reset_ls_timer((peer *)0x1a9575);
        iVar1 = *(int32_t *)(in_RDI + 0x38);
        _Var7 = std::__atomic_base::operator_cast_to_int
                          ((__atomic_base<int> *)
                           CONCAT44(in_stack_fffffffffffffa2c,in_stack_fffffffffffffa28));
        std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                  ((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   0x1a95a6);
        iVar8 = peer::get_id((peer *)0x1a95ae);
        _ctx = std::__shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>::get(&local_1e8);
        cb_func::Param::Param(&local_2c8,iVar1,_Var7,iVar8,_ctx);
        std::unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_>::operator->
                  ((unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_> *)0x1a95ff);
        cb_func::call((cb_func *)CONCAT44(in_stack_fffffffffffffa2c,in_stack_fffffffffffffa28),
                      in_stack_fffffffffffffa24,(Param *)in_stack_fffffffffffffa18);
        bVar4 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x3b8));
        if (bVar4) {
          std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                     0x1a964b);
          iVar8 = peer::get_id((peer *)0x1a9653);
          std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                     0x1a9669);
          iVar12 = peer::get_id((peer *)0x1a9671);
          if (iVar8 == iVar12) {
            peVar23 = std::
                      __shared_ptr_access<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)0x1a969d);
            uVar24 = req_msg::get_commit_idx(peVar23);
            if (*(ulong *)(in_RDI + 0x3c8) <= uVar24) {
              std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x1a96e0);
              bVar4 = peer::is_stepping_down((peer *)0x1a96e8);
              if (!bVar4) {
                std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x1a9716);
                peer::step_down((peer *)0x1a971e);
                bVar4 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
                if (bVar4) {
                  peVar17 = std::
                            __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                          *)0x1a9751);
                  iVar9 = (**(code **)(*(long *)peVar17 + 0x38))();
                  if (3 < iVar9) {
                    peVar17 = std::
                              __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                            *)0x1a978a);
                    std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)0x1a97a3);
                    uVar16 = peer::get_id((peer *)0x1a97ab);
                    peVar23 = std::
                              __shared_ptr_access<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              ::operator->((__shared_ptr_access<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                            *)0x1a97be);
                    uVar24 = req_msg::get_last_log_idx(peVar23);
                    peVar23 = std::
                              __shared_ptr_access<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              ::operator->((__shared_ptr_access<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                            *)0x1a97da);
                    uVar25 = req_msg::get_commit_idx(peVar23);
                    msg_if_given_abi_cxx11_
                              ((char *)local_2e8,
                               "srv_to_leave_ %d is safe to be erased from peer list, log idx %lu commit idx %lu, set flag"
                               ,(ulong)uVar16,uVar24,uVar25);
                    (**(code **)(*(long *)peVar17 + 0x40))
                              (peVar17,4,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_append_entries.cxx"
                               ,"request_append_entries",0x153,local_2e8);
                    std::__cxx11::string::~string(local_2e8);
                  }
                }
              }
            }
          }
        }
        bVar4 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
        if (bVar4) {
          peVar17 = std::
                    __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                    operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x1a98ce);
          iVar9 = (**(code **)(*(long *)peVar17 + 0x38))();
          if (5 < iVar9) {
            peVar17 = std::
                      __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)0x1a9901);
            msg_if_given_abi_cxx11_((char *)local_308,"sent\n");
            (**(code **)(*(long *)peVar17 + 0x40))
                      (peVar17,6,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_append_entries.cxx"
                       ,"request_append_entries",0x156,local_308);
            std::__cxx11::string::~string(local_308);
          }
        }
      }
      else {
        std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                  ((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   0x1a9169);
        peer::set_free((peer *)0x1a9171);
        peVar18 = std::
                  __shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x1a9180);
        local_279 = 0;
        local_4f1 = false;
        if ((peVar18->use_bg_thread_for_snapshot_io_ & 1U) != 0) {
          std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                     0x1a91a6);
          peer::get_snapshot_sync_ctx
                    ((peer *)CONCAT44(in_stack_fffffffffffffa3c,in_stack_fffffffffffffa38));
          local_279 = 1;
          local_4f1 = std::__shared_ptr::operator_cast_to_bool(local_278);
        }
        if ((local_279 & 1) != 0) {
          std::shared_ptr<nuraft::snapshot_sync_ctx>::~shared_ptr
                    ((shared_ptr<nuraft::snapshot_sync_ctx> *)0x1a91fb);
        }
        if (local_4f1 != false) {
          snapshot_io_mgr::instance();
          snapshot_io_mgr::invoke((snapshot_io_mgr *)0x1a9224);
        }
      }
      local_1 = 1;
      local_1b4 = 1;
      std::
      function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>
      ::~function((function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>
                   *)0x1a99a1);
      std::shared_ptr<nuraft::req_msg>::~shared_ptr((shared_ptr<nuraft::req_msg> *)0x1a99ae);
    }
    else {
      bVar4 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
      if (bVar4) {
        peVar17 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x1a9a03);
        iVar9 = (**(code **)(*(long *)peVar17 + 0x38))();
        if (4 < iVar9) {
          peVar17 = std::
                    __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                    operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x1a9a36);
          std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                     0x1a9a48);
          uVar16 = peer::get_id((peer *)0x1a9a50);
          msg_if_given_abi_cxx11_
                    ((char *)local_328,"Server %d is busy, skip the request",(ulong)uVar16);
          (**(code **)(*(long *)peVar17 + 0x40))
                    (peVar17,5,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_append_entries.cxx"
                     ,"request_append_entries",0x15a,local_328);
          std::__cxx11::string::~string(local_328);
        }
      }
      std::shared_ptr<nuraft::peer>::shared_ptr
                ((shared_ptr<nuraft::peer> *)
                 CONCAT44(in_stack_fffffffffffffa24,in_stack_fffffffffffffa20),
                 (shared_ptr<nuraft::peer> *)in_stack_fffffffffffffa18);
      check_snapshot_timeout
                ((raft_server *)CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8),
                 (ptr<peer> *)in_stack_fffffffffffffaa0);
      std::shared_ptr<nuraft::peer>::~shared_ptr((shared_ptr<nuraft::peer> *)0x1a9b13);
      std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x1a9b20);
      uVar21 = peer::get_ls_timer_us((peer *)0x1a9b28);
      auVar3._8_8_ = 0;
      auVar3._0_8_ = uVar21;
      uVar16 = SUB164(auVar3 / ZEXT816(1000),0);
      local_33c = uVar16;
      peVar18 = std::
                __shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x1a9b5d);
      if (peVar18->heart_beat_interval_ < (int)uVar16) {
        peVar22 = std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)0x1a9b7a);
        peer::inc_long_pause_warnings(peVar22);
        std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                  ((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   0x1a9b91);
        iVar8 = peer::get_long_puase_warnings((peer *)0x1a9b99);
        _Var7 = std::__atomic_base::operator_cast_to_int
                          ((__atomic_base<int> *)
                           CONCAT44(in_stack_fffffffffffffa2c,in_stack_fffffffffffffa28));
        if (iVar8 < _Var7) {
          bVar4 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
          if (bVar4) {
            peVar17 = std::
                      __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)0x1a9bee);
            iVar9 = (**(code **)(*(long *)peVar17 + 0x38))();
            if (2 < iVar9) {
              peVar17 = std::
                        __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                      *)0x1a9c21);
              std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x1a9c33);
              uVar16 = peer::get_id((peer *)0x1a9c3b);
              msg_if_given_abi_cxx11_
                        ((char *)local_360,
                         "skipped sending msg to %d too long time, last msg sent %d ms ago",
                         (ulong)uVar16,(ulong)local_33c);
              (**(code **)(*(long *)peVar17 + 0x40))
                        (peVar17,3,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_append_entries.cxx"
                         ,"request_append_entries",0x164,local_360);
              std::__cxx11::string::~string(local_360);
            }
          }
        }
        else {
          std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                     0x1a9d02);
          iVar8 = peer::get_long_puase_warnings((peer *)0x1a9d0a);
          _Var7 = std::__atomic_base::operator_cast_to_int
                            ((__atomic_base<int> *)CONCAT44(iVar8,in_stack_fffffffffffffa28));
          if ((iVar8 == _Var7) &&
             (bVar4 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318)),
             bVar4)) {
            peVar17 = std::
                      __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)0x1a9d5f);
            iVar9 = (**(code **)(*(long *)peVar17 + 0x38))();
            if (2 < iVar9) {
              peVar17 = std::
                        __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                      *)0x1a9d92);
              std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x1a9da3);
              uVar16 = peer::get_id((peer *)0x1a9dab);
              msg_if_given_abi_cxx11_
                        ((char *)local_380,
                         "long pause warning to %d is too verbose, will suppress it from now",
                         (ulong)uVar16);
              (**(code **)(*(long *)peVar17 + 0x40))
                        (peVar17,3,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_append_entries.cxx"
                         ,"request_append_entries",0x169,local_380);
              std::__cxx11::string::~string(local_380);
            }
          }
        }
      }
      local_1 = 0;
      local_1b4 = 1;
    }
  }
  else {
    snapshot_io_mgr::instance();
    std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x1a8b99);
    peer::get_id((peer *)0x1a8ba1);
    bVar4 = snapshot_io_mgr::has_pending_request
                      (in_stack_fffffffffffffa68,
                       (raft_server *)CONCAT44(in_stack_fffffffffffffa64,in_stack_fffffffffffffa60),
                       iVar9);
    if (!bVar4) goto LAB_001a8d11;
    bVar4 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
    if (bVar4) {
      peVar17 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x1a8c10);
      iVar9 = (**(code **)(*(long *)peVar17 + 0x38))();
      if (5 < iVar9) {
        peVar17 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x1a8c49);
        std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                  ((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   0x1a8c5e);
        uVar16 = peer::get_id((peer *)0x1a8c66);
        msg_if_given_abi_cxx11_
                  ((char *)local_1b0,"previous snapshot request for peer %d already exists",
                   (ulong)uVar16);
        (**(code **)(*(long *)peVar17 + 0x40))
                  (peVar17,6,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_append_entries.cxx"
                   ,"request_append_entries",0x101,local_1b0);
        std::__cxx11::string::~string(local_1b0);
      }
    }
    local_1 = 1;
    local_1b4 = 1;
  }
  std::shared_ptr<nuraft::raft_params>::~shared_ptr((shared_ptr<nuraft::raft_params> *)0x1a9e55);
LAB_001a9e66:
  return (bool)(local_1 & 1);
}

Assistant:

bool raft_server::request_append_entries(ptr<peer> p) {
    static timer_helper chk_timer(1000*1000);

    // Checking the validity of role first.
    if (role_ != srv_role::leader) {
        // WARNING: We should allow `write_paused_` state for
        //          graceful resignation.
        return false;
    }

    cb_func::Param cb_param(id_, leader_, p->get_id());
    CbReturnCode rc = ctx_->cb_func_.call(cb_func::RequestAppendEntries, &cb_param);
    if (rc == CbReturnCode::ReturnNull) {
        p_wn("by callback, abort request_append_entries");
        return true;
    }

    ptr<raft_params> params = ctx_->get_params();

    if ( params->auto_adjust_quorum_for_small_cluster_ &&
         get_num_voting_members() == 2 &&
         chk_timer.timeout_and_reset() ) {
        // If auto adjust mode is on for 2-node cluster, and
        // the follower is not responding, adjust the quorum.
        size_t num_not_responding_peers = get_not_responding_peers();
        size_t cur_quorum_size = get_quorum_for_commit();
        size_t num_stale_peers = get_num_stale_peers();
        if (cur_quorum_size >= 1) {
            bool do_adjustment = false;
            if (num_not_responding_peers) {
                p_wn("2-node cluster's follower is not responding long time, "
                     "adjust quorum to 1");
                do_adjustment = true;
            } else if (num_stale_peers) {
                p_wn("2-node cluster's follower is lagging behind, "
                     "adjust quorum to 1");
                do_adjustment = true;
            }
            if (do_adjustment) {
                ptr<raft_params> clone = cs_new<raft_params>(*params);
                clone->custom_commit_quorum_size_ = 1;
                clone->custom_election_quorum_size_ = 1;
                ctx_->set_params(clone);
            }

        } else if ( num_not_responding_peers == 0 &&
                    num_stale_peers == 0 &&
                    params->custom_commit_quorum_size_ == 1 ) {
            // Recovered, both cases should be clear.
            p_wn("2-node cluster's follower is responding now, "
                 "restore quorum with default value");
            ptr<raft_params> clone = cs_new<raft_params>(*params);
            clone->custom_commit_quorum_size_ = 0;
            clone->custom_election_quorum_size_ = 0;
            ctx_->set_params(clone);
        }
    }

    bool need_to_reconnect = p->need_to_reconnect();
    int32 last_active_time_ms = p->get_active_timer_us() / 1000;
    if ( last_active_time_ms >
             params->heart_beat_interval_ *
                 raft_server::raft_limits_.reconnect_limit_ ) {
        if (srv_to_leave_ && srv_to_leave_->get_id() == p->get_id()) {
            // We should not re-establish the connection to
            // to-be-removed server, as it will block removing it
            // from `peers_` list.
            p_wn( "connection to peer %d is not active long time: %d ms, "
                  "but this peer should be removed. do nothing",
                  p->get_id(),
                  last_active_time_ms );
        } else {
            p_wn( "connection to peer %d is not active long time: %d ms, "
                  "force re-connect",
                  p->get_id(),
                  last_active_time_ms );
            need_to_reconnect = true;
            p->reset_active_timer();
        }
    }
    if (need_to_reconnect) {
        bool reconnected = reconnect_client(*p);
        uint64_t p_next_log_idx = p->get_next_log_idx();
        if (reconnected && p_next_log_idx) {
            // NOTE:
            //   Discussions in https://github.com/eBay/NuRaft/issues/181
            //
            //   The leader keeps the last sent log info for each peer
            //   and sends the next `append_entries` request based on
            //   that data. This process disrupts offline data change,
            //   such as snapshot install, as the leader's peer info
            //   remains unchanged and results in wrong decisions. The
            //   right way to do this is to remove the node, install
            //   the snapshot, and then add the node back.
            //
            //   To avoid those hassles, we can reset the peer info that
            //   the leader has. Once any disconnection happens to a
            //   peer, we reset the last sent log info. The log info will
            //   be re-adjusted by the first `append_entries`
            //   communication between the leader and the peer. It will
            //   eventually have the same impact of removing and then
            //   re-adding the peer.
            //
            p_tr("new rpc for peer %d is created, "
                 "reset next log idx (%" PRIu64 ") and matched log idx (%" PRIu64 ")",
                 p->get_id(), p_next_log_idx, p->get_matched_idx());
            p->set_next_log_idx(0);
            p->set_matched_idx(0);
        }
        p->clear_reconnection();
    }

    if (params->use_bg_thread_for_snapshot_io_) {
        // Check the current queue if previous request exists.
        if (snapshot_io_mgr::instance().has_pending_request(this, p->get_id())) {
            p_tr( "previous snapshot request for peer %d already exists",
                  p->get_id() );
            return true;
        }
    }

    if (p->make_busy()) {
        p_tr("send request to %d\n", (int)p->get_id());

        // If reserved message exists, process it first.
        ptr<req_msg> msg = p->get_rsv_msg();
        rpc_handler m_handler = p->get_rsv_msg_handler();
        if (msg) {
            // Clear the reserved message.
            p->set_rsv_msg(nullptr, nullptr);
            p_in("found reserved message to peer %d, type %d",
                 p->get_id(), msg->get_type());

        } else {
            // Normal message.
            msg = create_append_entries_req(p);
            m_handler = resp_handler_;
        }

        if (!msg) {
            // Even normal message doesn't exist.
            p->set_free();
            if ( params->use_bg_thread_for_snapshot_io_ &&
                 p->get_snapshot_sync_ctx() ) {
                // If this is an async snapshot request, invoke IO thread.
                snapshot_io_mgr::instance().invoke();
            }
            return true;
        }

        if (!p->is_manual_free()) {
            // Actual recovery.
            if ( p->get_long_puase_warnings() >=
                     raft_server::raft_limits_.warning_limit_ ) {
                int32 last_ts_ms = p->get_ls_timer_us() / 1000;
                p->inc_recovery_cnt();
                p_wn( "recovered from long pause to peer %d, %d warnings, "
                      "%d ms, %d times",
                      p->get_id(),
                      p->get_long_puase_warnings(),
                      last_ts_ms,
                      p->get_recovery_cnt() );

                if (p->get_recovery_cnt() >= 10) {
                    // Re-connect client, just in case.
                    //reconnect_client(*p);
                    p->reset_recovery_cnt();
                }
            }
            p->reset_long_pause_warnings();

        } else {
            // FIXME: `manual_free` is deprecated, need to get rid of it.

            // It means that this is not an actual recovery,
            // but just temporarily freed busy flag.
            p->reset_manual_free();
        }

        p->send_req(p, msg, m_handler);
        p->reset_ls_timer();

        cb_func::Param param(id_, leader_, p->get_id(), msg.get());
        ctx_->cb_func_.call(cb_func::SentAppendEntriesReq, &param);

        if ( srv_to_leave_ &&
             srv_to_leave_->get_id() == p->get_id() &&
             msg->get_commit_idx() >= srv_to_leave_target_idx_ &&
             !srv_to_leave_->is_stepping_down() ) {
            // If this is the server to leave, AND
            // current request's commit index includes
            // the target log index number, step down and remove it
            // as soon as we get the corresponding response.
            srv_to_leave_->step_down();
            p_in("srv_to_leave_ %d is safe to be erased from peer list, "
                 "log idx %" PRIu64 " commit idx %" PRIu64 ", set flag",
                 srv_to_leave_->get_id(),
                 msg->get_last_log_idx(),
                 msg->get_commit_idx());
        }

        p_tr("sent\n");
        return true;
    }

    p_db("Server %d is busy, skip the request", p->get_id());
    check_snapshot_timeout(p);

    int32 last_ts_ms = p->get_ls_timer_us() / 1000;
    if ( last_ts_ms > params->heart_beat_interval_ ) {
        // Waiting time becomes longer than HB interval, warning.
        p->inc_long_pause_warnings();
        if (p->get_long_puase_warnings() < raft_server::raft_limits_.warning_limit_) {
            p_wn("skipped sending msg to %d too long time, "
                 "last msg sent %d ms ago",
                 p->get_id(), last_ts_ms);

        } else if ( p->get_long_puase_warnings() ==
                        raft_server::raft_limits_.warning_limit_ ) {
            p_wn("long pause warning to %d is too verbose, "
                 "will suppress it from now", p->get_id());
        }
    }
    return false;
}